

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

void copy_and_extend_plane
               (uint8_t *src,int src_pitch,uint8_t *dst,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right,int chroma_step)

{
  int j;
  long lVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  uint8_t *__s;
  size_t __n_00;
  uint8_t *puVar7;
  bool bVar8;
  byte *local_80;
  
  local_80 = src + (w + -1) * chroma_step;
  __n = (size_t)extend_left;
  lVar1 = -__n;
  iVar5 = 0;
  uVar4 = 0;
  if (0 < w) {
    uVar4 = (ulong)(uint)w;
  }
  iVar6 = 0;
  if (0 < h) {
    iVar6 = h;
  }
  puVar3 = dst + w;
  __s = dst + -__n;
  puVar7 = dst;
  for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
    memset(__s,(uint)*src,__n);
    if (chroma_step == 1) {
      memcpy(__s + __n,src,(long)w);
    }
    else {
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        puVar7[uVar2] = src[uVar2 * 2];
      }
    }
    memset(puVar3,(uint)*local_80,(long)extend_right);
    src = src + src_pitch;
    local_80 = local_80 + src_pitch;
    __s = __s + dst_pitch;
    puVar3 = puVar3 + dst_pitch;
    puVar7 = puVar7 + dst_pitch;
  }
  puVar3 = dst + -(dst_pitch * extend_top) + lVar1;
  __n_00 = (size_t)(extend_left + w + extend_right);
  iVar5 = 0;
  if (0 < extend_top) {
    iVar5 = extend_top;
  }
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    memcpy(puVar3,dst + -__n,__n_00);
    puVar3 = puVar3 + dst_pitch;
  }
  puVar3 = dst + lVar1 + h * dst_pitch;
  iVar5 = 0;
  if (0 < extend_bottom) {
    iVar5 = extend_bottom;
  }
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    memcpy(puVar3,dst + lVar1 + (h + -1) * dst_pitch,__n_00);
    puVar3 = puVar3 + dst_pitch;
  }
  return;
}

Assistant:

static void copy_and_extend_plane(const uint8_t *src, int src_pitch,
                                  uint8_t *dst, int dst_pitch, int w, int h,
                                  int extend_top, int extend_left,
                                  int extend_bottom, int extend_right,
                                  int chroma_step) {
  int i, linesize;
  // copy the left and right most columns out
  const uint8_t *src_ptr1 = src;
  const uint8_t *src_ptr2 = src + (w - 1) * chroma_step;
  uint8_t *dst_ptr1 = dst - extend_left;
  uint8_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    if (chroma_step == 1) {
      memcpy(dst_ptr1 + extend_left, src_ptr1, w);
    } else {
      for (int j = 0; j < w; j++) {
        dst_ptr1[extend_left + j] = src_ptr1[chroma_step * j];
      }
    }
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize);
    dst_ptr2 += dst_pitch;
  }
}